

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O2

bool MeCab::anon_unknown_20::connect<true>
               (size_t pos,Node *rnode,Node **begin_node_list,Node **end_node_list,
               Connector *connector,Allocator<mecab_node_t,_mecab_path_t> *allocator)

{
  mecab_node_t **ppmVar1;
  mecab_node_t *pmVar2;
  long lVar3;
  mecab_path_t *pmVar4;
  long lVar5;
  mecab_node_t *pmVar6;
  mecab_node_t **ppmVar7;
  long lVar8;
  
  ppmVar1 = begin_node_list + pos;
  for (; rnode != (mecab_node_t *)0x0; rnode = rnode->bnext) {
    lVar8 = 0x7fffffff;
    pmVar6 = (mecab_node_t *)0x0;
    ppmVar7 = ppmVar1;
    while (pmVar2 = *ppmVar7, pmVar2 != (mecab_node_t *)0x0) {
      lVar5 = (long)rnode->wcost +
              (long)*(short *)((long)&end_node_list[3]->prev +
                              (ulong)pmVar2->rcAttr * 2 +
                              (ulong)rnode->lcAttr * (ulong)*(ushort *)(end_node_list + 4) * 2);
      lVar3 = lVar5 + pmVar2->cost;
      if (lVar3 < lVar8) {
        lVar8 = lVar3;
        pmVar6 = pmVar2;
      }
      pmVar4 = Allocator<mecab_node_t,_mecab_path_t>::newPath
                         ((Allocator<mecab_node_t,_mecab_path_t> *)connector);
      pmVar4->cost = (int)lVar5;
      pmVar4->rnode = rnode;
      pmVar4->lnode = pmVar2;
      pmVar4->lnext = rnode->lpath;
      rnode->lpath = pmVar4;
      pmVar4->rnext = pmVar2->rpath;
      pmVar2->rpath = pmVar4;
      ppmVar7 = &pmVar2->enext;
    }
    if (pmVar6 == (mecab_node_t *)0x0) break;
    rnode->prev = pmVar6;
    rnode->next = (mecab_node_t *)0x0;
    rnode->cost = lVar8;
    rnode->enext = ppmVar1[rnode->rlength];
    ppmVar1[rnode->rlength] = rnode;
  }
  return rnode == (mecab_node_t *)0x0;
}

Assistant:

bool connect(size_t pos, Node *rnode,
                                       Node **begin_node_list,
                                       Node **end_node_list,
                                       const Connector *connector,
                                       Allocator<Node, Path> *allocator) {
  for (;rnode; rnode = rnode->bnext) {
    register long best_cost = 2147483647;
    Node* best_node = 0;
    for (Node *lnode = end_node_list[pos]; lnode; lnode = lnode->enext) {
      register int lcost = connector->cost(lnode, rnode);  // local cost
      register long cost = lnode->cost + lcost;

      if (cost < best_cost) {
        best_node  = lnode;
        best_cost  = cost;
  }

      if (IsAllPath) {
        Path *path   = allocator->newPath();
        path->cost   = lcost;
        path->rnode  = rnode;
        path->lnode  = lnode;
        path->lnext  = rnode->lpath;
        rnode->lpath = path;
        path->rnext  = lnode->rpath;
        lnode->rpath = path;
      }
    }

    // overflow check 2003/03/09
    if (!best_node) {
      return false;
  }

    rnode->prev = best_node;
    rnode->next = 0;
    rnode->cost = best_cost;
    const size_t x = rnode->rlength + pos;
    rnode->enext = end_node_list[x];
    end_node_list[x] = rnode;
  }

  return true;
  }